

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_ManPrintDistribStat(Cba_Man_t *p,int *pCounts,int *pUserCounts)

{
  Cba_Ntk_t *pCVar1;
  char *pcVar2;
  long lVar3;
  
  pCVar1 = Cba_ManRoot(p);
  puts("Primitives:");
  for (lVar3 = 0; lVar3 != 0x5a; lVar3 = lVar3 + 1) {
    if (pCounts[lVar3] != 0) {
      printf("%-20s = %5d\n",pCVar1->pDesign->pTypeNames[lVar3]);
    }
  }
  puts("User hierarchy:");
  for (lVar3 = 1; lVar3 < (p->vNtks).nSize; lVar3 = lVar3 + 1) {
    pCVar1 = Cba_ManNtk(p,(int)lVar3);
    if (pUserCounts[lVar3] != 0) {
      pcVar2 = Cba_NtkName(pCVar1);
      printf("%-20s = %5d\n",pcVar2,(ulong)(uint)pUserCounts[lVar3]);
    }
  }
  return;
}

Assistant:

void Cba_ManPrintDistribStat( Cba_Man_t * p, int * pCounts, int * pUserCounts )
{
    Cba_Ntk_t * pNtk = Cba_ManRoot(p); int i;
    printf( "Primitives:\n" );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        if ( pCounts[i] )
            printf( "%-20s = %5d\n", Cba_NtkTypeName(pNtk, i), pCounts[i] );
    printf( "User hierarchy:\n" );
    Cba_ManForEachNtk( p, pNtk, i )
        if ( pUserCounts[i] )
            printf( "%-20s = %5d\n", Cba_NtkName(pNtk), pUserCounts[i] );
}